

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init_cgmres.cpp
# Opt level: O0

void __thiscall
InitCGMRES::InitCGMRES(InitCGMRES *this,NMPCModel model,double difference_increment,int dim_krylov)

{
  int iVar1;
  int iVar2;
  Scalar *pSVar3;
  undefined8 *in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  double in_stack_00000008;
  double in_stack_00000010;
  double in_stack_00000018 [1];
  double in_stack_00000020;
  double in_stack_00000028;
  double in_stack_00000030;
  double in_stack_00000038;
  int i;
  Index in_stack_ffffffffffffff68;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_ffffffffffffff70;
  undefined8 *index;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined8 in_stack_ffffffffffffffa8;
  MatrixFreeGMRES *in_stack_ffffffffffffffb0;
  int local_28;
  
  NMPCModel::dimControlInput((NMPCModel *)&stack0x00000008);
  NMPCModel::dimConstraints((NMPCModel *)&stack0x00000008);
  MatrixFreeGMRES::MatrixFreeGMRES
            (in_stack_ffffffffffffffb0,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
             (int)in_stack_ffffffffffffffa8);
  *in_RDI = &PTR_bFunc_001c4d68;
  NMPCModel::NMPCModel((NMPCModel *)(in_RDI + 0x10));
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  in_RDI[0x16] = in_stack_00000038;
  in_RDI[0x14] = in_stack_00000028;
  in_RDI[0x15] = in_stack_00000030;
  in_RDI[0x12] = in_stack_00000018[0];
  in_RDI[0x13] = in_stack_00000020;
  in_RDI[0x10] = in_stack_00000008;
  in_RDI[0x11] = in_stack_00000010;
  in_RDI[0x18] = CONCAT44(in_XMM0_Db,in_XMM0_Da);
  iVar1 = NMPCModel::dimControlInput((NMPCModel *)(in_RDI + 0x10));
  iVar2 = NMPCModel::dimConstraints((NMPCModel *)(in_RDI + 0x10));
  *(int *)(in_RDI + 0x17) = iVar1 + iVar2;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  index = in_RDI + 0x1d;
  iVar1 = NMPCModel::dimState((NMPCModel *)(in_RDI + 0x10));
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  for (local_28 = 0; local_28 < *(int *)(in_RDI + 0x17); local_28 = local_28 + 1) {
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        CONCAT44(iVar1,in_stack_ffffffffffffff80),(Index)index);
    *pSVar3 = 0.0;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        CONCAT44(iVar1,in_stack_ffffffffffffff80),(Index)index);
    *pSVar3 = 0.0;
  }
  return;
}

Assistant:

InitCGMRES::InitCGMRES(const NMPCModel model, const double difference_increment, const int dim_krylov) : MatrixFreeGMRES(model.dimControlInput()+model.dimConstraints(), dim_krylov)
{
    // Set parameters.
    model_ = model;
    difference_increment_ = difference_increment;
    dim_solution_ = model_.dimControlInput()+model_.dimConstraints();

    // Allocate vectors.
    solution_update_vec_.resize(dim_solution_);
    incremented_solution_vec_.resize(dim_solution_);
    lambda_vec_.resize(model_.dimState());
    error_vec_.resize(dim_solution_);
    error_vec_1_.resize(dim_solution_);
    error_vec_2_.resize(dim_solution_);

    // Initialize solution of the forward-difference GMRES.
    for(int i=0; i<dim_solution_; i++){
        solution_update_vec_(i) = 0.0;
        error_vec_(i) = 0.0;
    }
}